

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

bool __thiscall
flatbuffers::Parser::ParseFlexBuffer
          (Parser *this,char *source,char *source_filename,Builder *builder)

{
  bool bVar1;
  byte local_51;
  undefined1 local_3e [15];
  undefined1 local_2f [10];
  bool ok;
  int initial_depth;
  Builder *builder_local;
  char *source_filename_local;
  char *source_local;
  Parser *this_local;
  
  local_2f._3_4_ = this->parse_depth_counter_;
  unique0x100000f2 = builder;
  builder_local = (Builder *)source_filename;
  source_filename_local = source;
  source_local = (char *)this;
  StartParseFile((Parser *)local_2f,(char *)this,source);
  bVar1 = CheckedError::Check((CheckedError *)local_2f);
  local_51 = 0;
  if (!bVar1) {
    ParseFlexBufferValue((Parser *)local_3e,(Builder *)this);
    bVar1 = CheckedError::Check((CheckedError *)local_3e);
    local_51 = bVar1 ^ 0xff;
    CheckedError::~CheckedError((CheckedError *)local_3e);
  }
  CheckedError::~CheckedError((CheckedError *)local_2f);
  local_2f[2] = local_51 & 1;
  if (local_2f[2] != 0) {
    flexbuffers::Builder::Finish(stack0xffffffffffffffd8);
  }
  if (local_2f._3_4_ == this->parse_depth_counter_) {
    return (bool)(local_2f[2] & 1);
  }
  __assert_fail("initial_depth == parse_depth_counter_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_parser.cpp"
                ,0xd83,
                "bool flatbuffers::Parser::ParseFlexBuffer(const char *, const char *, flexbuffers::Builder *)"
               );
}

Assistant:

bool Parser::ParseFlexBuffer(const char *source, const char *source_filename,
                             flexbuffers::Builder *builder) {
  const auto initial_depth = parse_depth_counter_;
  (void)initial_depth;
  auto ok = !StartParseFile(source, source_filename).Check() &&
            !ParseFlexBufferValue(builder).Check();
  if (ok) builder->Finish();
  FLATBUFFERS_ASSERT(initial_depth == parse_depth_counter_);
  return ok;
}